

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::AddVarToEntryPoints(IRContext *this,uint32_t var_id)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  Instruction *pIVar2;
  DefUseManager *this_00;
  uint32_t local_f4;
  iterator local_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  anon_class_24_3_fd1433c0 local_88;
  function<void_(unsigned_int_*)> local_70;
  bool local_49;
  Instruction *pIStack_48;
  bool found;
  Instruction *e;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  uint32_t ocnt;
  uint32_t var_id_local;
  IRContext *this_local;
  
  __range2._0_4_ = 0;
  __range2._4_4_ = var_id;
  _ocnt = this;
  module(this);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&e);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&e);
    if (!bVar1) break;
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    local_49 = false;
    local_88.ocnt = (uint32_t *)&__range2;
    local_88.found = &local_49;
    local_88.var_id = (uint32_t *)((long)&__range2 + 4);
    pIStack_48 = pIVar2;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::IRContext::AddVarToEntryPoints(unsigned_int)::__0,void>
              ((function<void(unsigned_int*)> *)&local_70,&local_88);
    Instruction::ForEachInOperand(pIVar2,&local_70);
    std::function<void_(unsigned_int_*)>::~function(&local_70);
    pIVar2 = pIStack_48;
    if ((local_49 & 1U) == 0) {
      local_f4 = __range2._4_4_;
      local_f0 = &local_f4;
      local_e8 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_f0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
      Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
      Instruction::AddOperand(pIVar2,&local_b8);
      Operand::~Operand(&local_b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
      this_00 = get_def_use_mgr(this);
      analysis::DefUseManager::AnalyzeInstDefUse(this_00,pIStack_48);
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return;
}

Assistant:

void IRContext::AddVarToEntryPoints(uint32_t var_id) {
  uint32_t ocnt = 0;
  for (auto& e : module()->entry_points()) {
    bool found = false;
    e.ForEachInOperand([&ocnt, &found, &var_id](const uint32_t* idp) {
      if (ocnt >= kEntryPointInterfaceInIdx) {
        if (*idp == var_id) found = true;
      }
      ++ocnt;
    });
    if (!found) {
      e.AddOperand({SPV_OPERAND_TYPE_ID, {var_id}});
      get_def_use_mgr()->AnalyzeInstDefUse(&e);
    }
  }
}